

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::InsertPropertyToDebuggerScope
          (ByteCodeGenerator *this,FuncInfo *funcInfo,DebuggerScope *debuggerScope,Symbol *sym)

{
  bool bVar1;
  RegSlot reg;
  PropertyId propertyId;
  FunctionBody *this_00;
  Symbol *this_01;
  DebuggerScopePropertyFlags flags;
  
  if (sym == (Symbol *)0x0) {
    return;
  }
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  reg = sym->location;
  bVar1 = ShouldTrackDebuggerMetadata(this);
  flags = 0;
  if ((bVar1) && (flags = 0, (funcInfo->field_0xb5 & 0x80) == 0)) {
    for (this_01 = funcInfo->bodyScope->m_symList; this_01 != (Symbol *)0x0; this_01 = this_01->next
        ) {
      bVar1 = JsUtil::CharacterBuffer<char16_t>::operator==(&this_01->name,&sym->name);
      if (bVar1) {
        reg = Js::FunctionBody::MapRegSlot(this_00,reg);
        flags = 0x16;
        break;
      }
    }
  }
  propertyId = Symbol::EnsurePosition(sym,funcInfo);
  Js::DebuggerScope::AddProperty(debuggerScope,reg,propertyId,flags);
  return;
}

Assistant:

void ByteCodeGenerator::InsertPropertyToDebuggerScope(FuncInfo* funcInfo, Js::DebuggerScope* debuggerScope, Symbol* sym)
{
    if (sym)
    {
        Js::FunctionBody* funcBody = funcInfo->GetParsedFunctionBody();
        Js::DebuggerScopePropertyFlags flag = Js::DebuggerScopePropertyFlags_None;
        Js::RegSlot location = sym->GetLocation();
        if (ShouldTrackDebuggerMetadata() && !funcInfo->IsBodyAndParamScopeMerged() && funcInfo->bodyScope->FindLocalSymbol(sym->GetName()) != nullptr)
        {
            flag |= Js::DebuggerScopePropertyFlags_HasDuplicateInBody;
            location = funcBody->MapRegSlot(location);
        }

        debuggerScope->AddProperty(location, sym->EnsurePosition(funcInfo), flag);
    }
}